

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

numeric_type __thiscall
viennamath::rt_variable<viennamath::rt_expression_interface<double>_>::eval
          (rt_variable<viennamath::rt_expression_interface<double>_> *this,numeric_type val)

{
  id_type iVar1;
  undefined8 *puVar2;
  
  if (this->id_ == 0) {
    return val;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x18);
  iVar1 = this->id_;
  *puVar2 = &PTR__exception_001187f0;
  puVar2[1] = iVar1;
  puVar2[2] = 1;
  __cxa_throw(puVar2,&variable_index_out_of_bounds_exception::typeinfo,std::exception::~exception);
}

Assistant:

numeric_type eval(numeric_type val) const
      {
        if (id_ > 0)
          throw variable_index_out_of_bounds_exception(static_cast<long>(id_), 1);

        return val;
      }